

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.hpp
# Opt level: O2

bool commandExists(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *rules,string *input)

{
  __type _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar5;
  
  p_Var3 = &(rules->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var2 = (rules->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    lVar5 = 0;
    uVar4 = 0xffffffffffffffff;
    while( true ) {
      uVar4 = uVar4 + 1;
      if ((ulong)((long)p_Var2[2]._M_parent - *(long *)(p_Var2 + 2) >> 5) <= uVar4) break;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (*(long *)(p_Var2 + 2) + lVar5);
      lVar5 = lVar5 + 0x20;
      _Var1 = std::operator==(__lhs,input);
      if (_Var1) goto LAB_001142da;
    }
  }
LAB_001142da:
  return (_Rb_tree_header *)p_Var2 != p_Var3;
}

Assistant:

bool commandExists(map<string, vector<string> > rules, string input) {
    for (map<string, vector<string> >::iterator it = rules.begin(); it != rules.end(); ++it) {
		for (int i = 0; i < it->second.size(); i++) {
			if (it->second[i] == input) {
				return true;
			}
		}
	}
	return false;
}